

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

uint8_t duckdb::StringUtil::GetHexValue(char c)

{
  byte bVar1;
  InvalidInputException *this;
  allocator local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  bVar1 = c - 0x30;
  if (9 < bVar1) {
    if ((byte)(c + 0x9fU) < 6) {
      bVar1 = c + 0xa9;
    }
    else {
      if (5 < (byte)(c + 0xbfU)) {
        this = (InvalidInputException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_38,"Invalid input for hex digit: %s",&local_59);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
        InvalidInputException::InvalidInputException<std::__cxx11::string>(this,&local_38,&local_58)
        ;
        __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
      }
      bVar1 = c - 0x37;
    }
  }
  return bVar1;
}

Assistant:

static uint8_t GetHexValue(char c) {
		if (c >= '0' && c <= '9') {
			return UnsafeNumericCast<uint8_t>(c - '0');
		}
		if (c >= 'a' && c <= 'f') {
			return UnsafeNumericCast<uint8_t>(c - 'a' + 10);
		}
		if (c >= 'A' && c <= 'F') {
			return UnsafeNumericCast<uint8_t>(c - 'A' + 10);
		}
		throw InvalidInputException("Invalid input for hex digit: %s", string(1, c));
	}